

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

bool __thiscall HighFreqDataType::operator<(HighFreqDataType *this,HighFreqDataType *obj)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool retval;
  bool local_11;
  
  local_11 = std::operator>(in_RDI,in_RSI);
  local_11 = !local_11;
  bVar1 = std::operator>(in_RDI,in_RSI);
  if (bVar1) {
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool HighFreqDataType::operator <(const HighFreqDataType obj) const {
    bool retval = true;
    if (name > obj.name)
        retval = false;
    if (origin > obj.origin)
        retval = false;

    return(retval);
}